

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_GetNextWave
               (FACTCue *cue,FACTSound *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst)

{
  undefined8 uVar1;
  code *pcVar2;
  short sVar3;
  int iVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  float fVar5;
  float fVar6;
  double dVar7;
  float rngFrequency;
  float rngQFactor;
  float rngVolume;
  uint32_t in_stack_0000001c;
  int16_t rngPitch;
  SDL_AssertState sdl_assert_state;
  uint32_t i;
  uint8_t noTrackVariation;
  FACTWaveBank *in_stack_00000028;
  float next;
  float max;
  uint8_t loopCount;
  uint8_t wbIndex;
  uint16_t wbTrack;
  LinkedList *list;
  FACTWaveBank *wb;
  char *wbName;
  FAudioVoiceSends reverbSends;
  FAudioSendDescriptor reverbDesc [2];
  uint32_t in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined4 uVar8;
  uint local_84;
  undefined3 in_stack_ffffffffffffff80;
  uint uVar9;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  char cVar10;
  byte bVar11;
  undefined2 uVar12;
  long *local_70;
  long local_68;
  
  local_68 = 0;
  cVar10 = '\0';
  uVar9 = CONCAT13(1,in_stack_ffffffffffffff80);
  if (*(char *)(in_R8 + 0xe) == '\0') {
    bVar11 = *(byte *)(in_R8 + 0x12);
    uVar12 = *(undefined2 *)(in_R8 + 0x10);
  }
  else {
    if ((*(long *)(in_RCX + 0x28) != 0) && ((*(ushort *)(in_R8 + 0x10) & 0xf0) != 0)) {
      if (((*(ushort *)(in_R8 + 0x10) & 0xf) == 0) || ((*(ushort *)(in_R8 + 0x10) & 0xf) == 1)) {
        *(int *)(in_R9 + 8) = *(int *)(in_R9 + 8) + 1;
        if ((uint)*(ushort *)(in_R8 + 0x12) <= *(uint *)(in_R9 + 8)) {
          *(undefined4 *)(in_R9 + 8) = 0;
        }
      }
      else if ((*(ushort *)(in_R8 + 0x10) & 0xf) == 2) {
        in_stack_ffffffffffffff88 = 0.0;
        for (local_84 = 0; local_84 < *(ushort *)(in_R8 + 0x12); local_84 = local_84 + 1) {
          in_stack_ffffffffffffff88 =
               (float)*(byte *)(*(long *)(in_R8 + 0x28) + (ulong)local_84) +
               in_stack_ffffffffffffff88;
        }
        dVar7 = stb_frand();
        in_stack_ffffffffffffff84 = (float)dVar7 * in_stack_ffffffffffffff88;
        for (local_84 = (uint)*(ushort *)(in_R8 + 0x12); local_84 != 0; local_84 = local_84 - 1) {
          if (in_stack_ffffffffffffff88 -
              (float)*(byte *)(*(long *)(in_R8 + 0x28) + (ulong)(local_84 - 1)) <
              in_stack_ffffffffffffff84) {
            *(uint *)(in_R9 + 8) = local_84 - 1;
            break;
          }
          in_stack_ffffffffffffff88 =
               in_stack_ffffffffffffff88 -
               (float)*(byte *)(*(long *)(in_R8 + 0x28) + (ulong)(local_84 - 1));
        }
      }
      else if (((*(ushort *)(in_R8 + 0x10) & 0xf) == 3) || ((*(ushort *)(in_R8 + 0x10) & 0xf) == 4))
      {
        in_stack_ffffffffffffff88 = 0.0;
        for (local_84 = 0; local_84 < *(ushort *)(in_R8 + 0x12); local_84 = local_84 + 1) {
          if (local_84 != *(uint *)(in_R9 + 8)) {
            in_stack_ffffffffffffff88 =
                 (float)*(byte *)(*(long *)(in_R8 + 0x28) + (ulong)local_84) +
                 in_stack_ffffffffffffff88;
          }
        }
        dVar7 = stb_frand();
        in_stack_ffffffffffffff84 = (float)dVar7 * in_stack_ffffffffffffff88;
        for (local_84 = (uint)*(ushort *)(in_R8 + 0x12); local_84 != 0; local_84 = local_84 - 1) {
          if (local_84 - 1 != *(int *)(in_R9 + 8)) {
            if (in_stack_ffffffffffffff88 -
                (float)*(byte *)(*(long *)(in_R8 + 0x28) + (ulong)(local_84 - 1)) <
                in_stack_ffffffffffffff84) {
              *(uint *)(in_R9 + 8) = local_84 - 1;
              break;
            }
            in_stack_ffffffffffffff88 =
                 in_stack_ffffffffffffff88 -
                 (float)*(byte *)(*(long *)(in_R8 + 0x28) + (ulong)(local_84 - 1));
          }
        }
      }
    }
    if ((*(ushort *)(in_R8 + 0x10) & 0xf0) != 0) {
      uVar9 = uVar9 & 0xffffff;
    }
    bVar11 = *(byte *)(*(long *)(in_R8 + 0x20) + (ulong)*(uint *)(in_R9 + 8));
    uVar12 = *(undefined2 *)(*(long *)(in_R8 + 0x18) + (ulong)*(uint *)(in_R9 + 8) * 2);
  }
  uVar1 = *(undefined8 *)(*(long *)(*in_RDI + 0x30) + (ulong)bVar11 * 8);
  for (local_70 = *(long **)(*(long *)*in_RDI + 0x78); local_70 != (long *)0x0;
      local_70 = (long *)local_70[1]) {
    local_68 = *local_70;
    iVar4 = SDL_strcmp(uVar1,*(undefined8 *)(local_68 + 0x28));
    if (iVar4 == 0) break;
  }
  do {
    if (local_68 != 0) goto LAB_00117d87;
    iVar4 = SDL_ReportAssertion(&FACT_INTERNAL_GetNextWave::sdl_assert_data,
                                "FACT_INTERNAL_GetNextWave",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                ,0x11e);
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
LAB_00117d87:
  if (((*(short *)(in_R9 + 4) == 0xff) && ((char)(uVar9 >> 0x18) != '\0')) &&
     ((*(ushort *)(in_R8 + 0x4c) & 0xf00) == 0)) {
    cVar10 = -1;
  }
  FACTWaveBank_Prepare
            (in_stack_00000028,i._2_2_,sdl_assert_state,in_stack_0000001c,rngVolume._3_1_,
             _rngFrequency);
  *(long **)(*(long *)(in_RCX + 0x40) + 8) = in_RDI;
  if (*(char *)(in_RSI + 0xd) != '\0') {
    FAudioVoice_SetOutputVoices
              ((FAudioVoice *)
               CONCAT26(uVar12,CONCAT15(bVar11,CONCAT14(cVar10,in_stack_ffffffffffffff88))),
               (FAudioVoiceSends *)CONCAT44(in_stack_ffffffffffffff84,uVar9));
  }
  if (*(char *)((long)in_RDI + 0x5c) != '\0') {
    FACTWave_SetMatrixCoefficients
              (*(FACTWave **)(in_RCX + 0x40),*(uint32_t *)(in_RDI + 0xc),
               *(uint32_t *)((long)in_RDI + 100),(float *)(in_RDI + 0xd));
  }
  if ((*(ushort *)(in_R8 + 0x4c) & 0x1000) == 0) {
    *(undefined2 *)(in_RCX + 0x4c) = *(undefined2 *)(in_RSI + 8);
  }
  else {
    dVar7 = stb_frand();
    sVar3 = (short)(int)((float)dVar7 *
                        (float)((int)*(short *)(in_R8 + 0x32) - (int)*(short *)(in_R8 + 0x30))) +
            *(short *)(in_R8 + 0x30);
    if (*(long *)(in_RCX + 0x28) == 0) {
      *(short *)(in_RCX + 0x4c) = sVar3 + *(short *)(in_RSI + 8);
    }
    else if ((*(ushort *)(in_R8 + 0x4c) & 0x100) != 0) {
      if ((*(ushort *)(in_R8 + 0x4c) & 4) == 0) {
        *(short *)(in_RCX + 0x4c) = sVar3 + *(short *)(in_RSI + 8);
      }
      else {
        *(short *)(in_RCX + 0x4c) = *(short *)(in_RCX + 0x34) + sVar3;
      }
    }
  }
  if ((*(ushort *)(in_R8 + 0x4c) & 0x2000) == 0) {
    *(float *)(in_RCX + 0x48) = *(float *)(in_RSI + 4) + *(float *)(in_RDX + 4);
  }
  else {
    dVar7 = stb_frand();
    fVar5 = (float)dVar7 * (*(float *)(in_R8 + 0x38) - *(float *)(in_R8 + 0x34)) +
            *(float *)(in_R8 + 0x34);
    if (*(long *)(in_RCX + 0x28) == 0) {
      *(float *)(in_RCX + 0x48) = fVar5 + *(float *)(in_RSI + 4) + *(float *)(in_RDX + 4);
    }
    else if ((*(ushort *)(in_R8 + 0x4c) & 0x200) != 0) {
      if ((*(ushort *)(in_R8 + 0x4c) & 1) == 0) {
        *(float *)(in_RCX + 0x48) = fVar5 + *(float *)(in_RSI + 4) + *(float *)(in_RDX + 4);
      }
      else {
        *(float *)(in_RCX + 0x48) = *(float *)(in_RCX + 0x30) + fVar5;
      }
    }
  }
  if ((*(ushort *)(in_R8 + 0x4c) & 0xc000) == 0) {
    *(float *)(in_RCX + 0x50) = 1.0 / ((float)*(byte *)(in_RDX + 9) / 3.0);
    fVar5 = FACT_INTERNAL_CalculateFilterFrequency
                      (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    *(float *)(in_RCX + 0x54) = fVar5;
    if (1.0 < *(float *)(in_RCX + 0x50) || *(float *)(in_RCX + 0x50) == 1.0) {
      uVar8 = 0x3f800000;
    }
    else {
      uVar8 = *(undefined4 *)(in_RCX + 0x50);
    }
    *(undefined4 *)(in_RCX + 0x50) = uVar8;
  }
  else {
    dVar7 = stb_frand();
    fVar5 = 1.0 / ((float)dVar7 * (*(float *)(in_R8 + 0x48) - *(float *)(in_R8 + 0x44)) +
                  *(float *)(in_R8 + 0x44));
    stb_frand();
    fVar6 = FACT_INTERNAL_CalculateFilterFrequency
                      (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    if (*(long *)(in_RCX + 0x28) == 0) {
      *(float *)(in_RCX + 0x50) = fVar5;
      *(float *)(in_RCX + 0x54) = fVar6;
    }
    else if ((*(ushort *)(in_R8 + 0x4c) & 0xc00) != 0) {
      *(float *)(in_RCX + 0x50) = fVar5;
      *(float *)(in_RCX + 0x54) = fVar6;
    }
  }
  if (cVar10 == -1) {
    *(undefined2 *)(in_R9 + 4) = 0;
  }
  else if (*(short *)(in_R9 + 4) != 0) {
    *(short *)(in_R9 + 4) = *(short *)(in_R9 + 4) + -1;
  }
  return;
}

Assistant:

void FACT_INTERNAL_GetNextWave(
	FACTCue *cue,
	FACTSound *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst
) {
	FAudioSendDescriptor reverbDesc[2];
	FAudioVoiceSends reverbSends;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	uint16_t wbTrack;
	uint8_t wbIndex;
	uint8_t loopCount = 0;
	float max, next;
	uint8_t noTrackVariation = 1;
	uint32_t i;

	/* Track Variation */
	if (evt->wave.isComplex)
	{
		if (	trackInst->activeWave.wave == NULL ||
			!(evt->wave.complex.variation & 0x00F0)	)
		{
			/* No-op, no variation on loop */
		}
		/* Ordered, Ordered From Random */
		else if (	(evt->wave.complex.variation & 0xF) == 0 ||
				(evt->wave.complex.variation & 0xF) == 1	)
		{
			evtInst->valuei += 1;
			if (evtInst->valuei >= evt->wave.complex.trackCount)
			{
				evtInst->valuei = 0;
			}
		}
		/* Random */
		else if ((evt->wave.complex.variation & 0xF) == 2)
		{
			max = 0.0f;
			for (i = 0; i < evt->wave.complex.trackCount; i += 1)
			{
				max += evt->wave.complex.weights[i];
			}
			next = FACT_INTERNAL_rng() * max;
			for (i = evt->wave.complex.trackCount; i > 0; i -= 1)
			{
				if (next > (max - evt->wave.complex.weights[i - 1]))
				{
					evtInst->valuei = i - 1;
					break;
				}
				max -= evt->wave.complex.weights[i - 1];
			}
		}
		/* Random (No Immediate Repeats), Shuffle */
		else if (	(evt->wave.complex.variation & 0xF) == 3 ||
				(evt->wave.complex.variation & 0xF) == 4	)
		{
			max = 0.0f;
			for (i = 0; i < evt->wave.complex.trackCount; i += 1)
			{
				if (i == evtInst->valuei)
				{
					continue;
				}
				max += evt->wave.complex.weights[i];
			}
			next = FACT_INTERNAL_rng() * max;
			for (i = evt->wave.complex.trackCount; i > 0; i -= 1)
			{
				if (i - 1 == evtInst->valuei)
				{
					continue;
				}
				if (next > (max - evt->wave.complex.weights[i - 1]))
				{
					evtInst->valuei = i - 1;
					break;
				}
				max -= evt->wave.complex.weights[i - 1];
			}
		}

		if (evt->wave.complex.variation & 0x00F0)
		{
			noTrackVariation = 0;
		}

		wbIndex = evt->wave.complex.wavebanks[evtInst->valuei];
		wbTrack = evt->wave.complex.tracks[evtInst->valuei];
	}
	else
	{
		wbIndex = evt->wave.simple.wavebank;
		wbTrack = evt->wave.simple.track;
	}
	wbName = cue->parentBank->wavebankNames[wbIndex];
	list = cue->parentBank->parentEngine->wbList;
	while (list != NULL)
	{
		wb = (FACTWaveBank*) list->entry;
		if (FAudio_strcmp(wbName, wb->name) == 0)
		{
			break;
		}
		list = list->next;
	}
	FAudio_assert(wb != NULL);

	/* Generate the Wave */
	if (	evtInst->loopCount == 255 &&
		noTrackVariation &&
		!(evt->wave.variationFlags & 0x0F00)	)
	{
		/* For infinite loops with no variation, let Wave do the work */
		loopCount = 255;
	}
	FACTWaveBank_Prepare(
		wb,
		wbTrack,
		evt->wave.flags,
		0,
		loopCount,
		&trackInst->upcomingWave.wave
	);
	trackInst->upcomingWave.wave->parentCue = cue;
	if (sound->dspCodeCount > 0) /* Never more than 1...? */
	{
		reverbDesc[0].Flags = 0;
		reverbDesc[0].pOutputVoice = cue->parentBank->parentEngine->master;
		reverbDesc[1].Flags = 0;
		reverbDesc[1].pOutputVoice = cue->parentBank->parentEngine->reverbVoice;
		reverbSends.SendCount = 2;
		reverbSends.pSends = reverbDesc;
		FAudioVoice_SetOutputVoices(
			trackInst->upcomingWave.wave->voice,
			&reverbSends
		);
	}

	/* 3D Audio */
	if (cue->active3D)
	{
		FACTWave_SetMatrixCoefficients(
			trackInst->upcomingWave.wave,
			cue->srcChannels,
			cue->dstChannels,
			cue->matrixCoefficients
		);
	}
	else
	{
		/* TODO: Position/Angle/UseCenterSpeaker */
	}

	/* Pitch Variation */
	if (evt->wave.variationFlags & 0x1000)
	{
		const int16_t rngPitch = (int16_t) (
			FACT_INTERNAL_rng() *
			(evt->wave.maxPitch - evt->wave.minPitch)
		) + evt->wave.minPitch;
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0100)
			{
				/* Add/Replace */
				if (evt->wave.variationFlags & 0x0004)
				{
					trackInst->upcomingWave.basePitch =
						trackInst->activeWave.basePitch + rngPitch;
				}
				else
				{
					trackInst->upcomingWave.basePitch = rngPitch + sound->pitch;
				}
			}
		}
		else
		{
			/* Initial Pitch Variation */
			trackInst->upcomingWave.basePitch = rngPitch + sound->pitch;
		}
	}
	else
	{
		trackInst->upcomingWave.basePitch = sound->pitch;
	}

	/* Volume Variation */
	if (evt->wave.variationFlags & 0x2000)
	{
		const float rngVolume = (
			FACT_INTERNAL_rng() *
			(evt->wave.maxVolume - evt->wave.minVolume)
		) + evt->wave.minVolume;
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0200)
			{
				/* Add/Replace */
				if (evt->wave.variationFlags & 0x0001)
				{
					trackInst->upcomingWave.baseVolume =
						trackInst->activeWave.baseVolume + rngVolume;
				}
				else
				{
					trackInst->upcomingWave.baseVolume = (
						rngVolume +
						sound->volume +
						track->volume
					);
				}
			}
		}
		else
		{
			/* Initial Volume Variation */
			trackInst->upcomingWave.baseVolume = (
				rngVolume +
				sound->volume +
				track->volume
			);
		}
	}
	else
	{
		trackInst->upcomingWave.baseVolume = sound->volume + track->volume;
	}

	/* Filter Variation, QFactor/Freq are always together */
	if (evt->wave.variationFlags & 0xC000)
	{
		const float rngQFactor = 1.0f / (
			FACT_INTERNAL_rng() *
			(evt->wave.maxQFactor - evt->wave.minQFactor) +
			evt->wave.minQFactor
		);
		const float rngFrequency = FACT_INTERNAL_CalculateFilterFrequency(
			(
				FACT_INTERNAL_rng() *
				(evt->wave.maxFrequency - evt->wave.minFrequency) +
				evt->wave.minFrequency
			),
			cue->parentBank->parentEngine->audio->master->master.inputSampleRate
		);
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0C00)
			{
				/* TODO: Add/Replace */
				/* FIXME: Which is QFactor/Freq?
				if (evt->wave.variationFlags & 0x0010)
				{
				}
				else
				{
				}
				if (evt->wave.variationFlags & 0x0040)
				{
				}
				else
				{
				}
				*/
				trackInst->upcomingWave.baseQFactor = rngQFactor;
				trackInst->upcomingWave.baseFrequency = rngFrequency;
			}
		}
		else
		{
			/* Initial Filter Variation */
			trackInst->upcomingWave.baseQFactor = rngQFactor;
			trackInst->upcomingWave.baseFrequency = rngFrequency;
		}
	}
	else
	{
		trackInst->upcomingWave.baseQFactor = 1.0f / (track->qfactor / 3.0f);
		trackInst->upcomingWave.baseFrequency = FACT_INTERNAL_CalculateFilterFrequency(
			track->frequency,
			cue->parentBank->parentEngine->audio->master->master.inputSampleRate
		);

		/* FIXME: For some reason the 0.67 Q Factor causes problems, but it's also
		 * the only possible value until ~1 so just clamp it for now.
		 */
		trackInst->upcomingWave.baseQFactor = FAudio_min(
			trackInst->upcomingWave.baseQFactor,
			1.0f
		);
	}

	/* Try to change loop counter at the very end */
	if (loopCount == 255)
	{
		/* For infinite loops with no variation, Wave does the work */
		evtInst->loopCount = 0;
	}
	else if (evtInst->loopCount > 0)
	{
		evtInst->loopCount -= 1;
	}
}